

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O3

CompiledMethod * __thiscall
Lodtalk::MethodAssembler::Assembler::generate
          (Assembler *this,size_t temporalCount,size_t argumentCount,bool hasPrimitive,
          size_t extraSize)

{
  pointer ppIVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  CompiledMethodHeader header;
  CompiledMethod *pCVar5;
  pointer pOVar6;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  ulong uVar8;
  InstructionNode *pIVar9;
  pointer ppIVar10;
  undefined1 *puVar11;
  undefined1 *puVar7;
  
  sVar3 = computeInstructionsSize(this);
  lVar4 = (long)(this->literals).
                super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->literals).
                super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>._M_impl.
                super__Vector_impl_data._M_start;
  header = CompiledMethodHeader::create
                     (lVar4 >> 5,temporalCount,argumentCount,
                      (ulong)(uint)((int)CONCAT71(in_register_00000009,hasPrimitive) << 0x11));
  pCVar5 = CompiledMethod::newMethodWithHeader
                     (this->context,extraSize + sVar3 + (lVar4 >> 2),header);
  pOVar6 = (this->literals).super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->literals).super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>._M_impl
      .super__Vector_impl_data._M_finish != pOVar6) {
    lVar4 = 0;
    uVar8 = 0;
    do {
      pCVar5[uVar8 + 2].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
      super_Collection.super_Object.super_ProtoObject.object_header_ =
           *(ObjectHeader *)((long)&(pOVar6->oop).field_0 + lVar4);
      uVar8 = uVar8 + 1;
      pOVar6 = (this->literals).
               super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x20;
    } while (uVar8 < (ulong)((long)(this->literals).
                                   super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar6 >> 5));
  }
  uVar8 = (ulong)(*(uint *)&pCVar5[1].super_ByteArray.super_ArrayedCollection.
                            super_SequenceableCollection.super_Collection.super_Object.
                            super_ProtoObject.object_header_ & 0x1fffe);
  puVar7 = &pCVar5[2].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
            super_Collection.super_Object.super_ProtoObject.object_header_.field_0x0 + uVar8 * 4;
  puVar11 = &pCVar5[2].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
             super_Collection.super_Object.super_ProtoObject.object_header_.field_0x0 +
            sVar3 + uVar8 * 4;
  ppIVar10 = (this->instructionStream).
             super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->instructionStream).
            super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppIVar10 == ppIVar1) {
      if (puVar7 < puVar11) {
        printf("extra size %zu\n",(long)puVar11 - (long)puVar7);
      }
      return pCVar5;
    }
    pIVar9 = *ppIVar10;
    iVar2 = (*pIVar9->_vptr_InstructionNode[3])(pIVar9,puVar7);
    puVar7 = (undefined1 *)CONCAT44(extraout_var,iVar2);
    if (puVar11 < puVar7) break;
    ppIVar10 = ppIVar10 + 1;
  }
  generate();
  if ((_func_int **)pIVar9->lastSize != pIVar9[1]._vptr_InstructionNode) {
    return (CompiledMethod *)pIVar9[1]._vptr_InstructionNode[-1];
  }
  return (CompiledMethod *)0x0;
}

Assistant:

CompiledMethod *Assembler::generate(size_t temporalCount, size_t argumentCount, bool hasPrimitive, size_t extraSize)
{
	// Compute the method sizes.
	auto instructionsSize = computeInstructionsSize();
	auto literalCount = literals.size();
	auto methodSize = literalCount*sizeof(void*) + instructionsSize + extraSize;

	// Create the method header
    size_t extraFlags = 0;
    if(hasPrimitive)
        extraFlags |= CompiledMethodHeader::HasPrimitiveBit;

	auto methodHeader = CompiledMethodHeader::create(literalCount, temporalCount, argumentCount, extraFlags);

	// Create the compiled method
	auto compiledMethod = CompiledMethod::newMethodWithHeader(context, methodSize, methodHeader);

	// Set the compiled method literals
	auto literalData = compiledMethod->getFirstLiteralPointer();
	for(size_t i = 0; i < literals.size(); ++i)
		literalData[i] = literals[i].oop;

	// Encode the bytecode instructions.
	auto instructionBuffer = compiledMethod->getFirstBCPointer();
	auto instructionBufferEnd = instructionBuffer + instructionsSize;
	for(auto &instr : instructionStream)
	{
		instructionBuffer = instr->encode(instructionBuffer);
		if(instructionBuffer > instructionBufferEnd)
		{
			fprintf(stderr, "Fatal error: Memory corruption\n");
			abort();
		}
	}

    if(instructionBuffer < instructionBufferEnd)
        printf("extra size %zu\n", instructionBufferEnd - instructionBuffer);

	return compiledMethod;
}